

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O1

void gl_ParseHardwareShader(FScanner *sc,int deflump)

{
  FString *pFVar1;
  FString __s2;
  bool bVar2;
  FTextureID FVar3;
  int iVar4;
  FTexture *pFVar5;
  ulong uVar6;
  ulong uVar7;
  FString maplumpname;
  FString local_40;
  float local_34;
  
  local_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  bVar2 = FScanner::Compare(sc,"texture");
  iVar4 = 1;
  if (!bVar2) {
    bVar2 = FScanner::Compare(sc,"flat");
    iVar4 = 2;
    if (!bVar2) {
      bVar2 = FScanner::Compare(sc,"sprite");
      iVar4 = 3;
      if (!bVar2) {
        iVar4 = 0;
        FScanner::UnGet(sc);
      }
    }
  }
  FScanner::MustGetString(sc);
  FVar3 = FTextureManager::CheckForTexture(&TexMan,sc->String,iVar4,1);
  if ((uint)FVar3.texnum < TexMan.Textures.Count) {
    pFVar5 = TexMan.Textures.Array[FVar3.texnum].Texture;
  }
  else {
    pFVar5 = (FTexture *)0x0;
  }
  FScanner::MustGetToken(sc,0x7b);
  local_34 = 1.0;
  while( true ) {
    bVar2 = FScanner::CheckToken(sc,0x7d);
    __s2.Chars = local_40.Chars;
    if (bVar2) break;
    FScanner::MustGetString(sc);
    bVar2 = FScanner::Compare(sc,"shader");
    if (bVar2) {
      FScanner::MustGetString(sc);
      FString::operator=(&local_40,sc->String);
    }
    else {
      bVar2 = FScanner::Compare(sc,"speed");
      if (bVar2) {
        FScanner::MustGetFloat(sc);
        local_34 = (float)sc->Float;
      }
    }
  }
  if ((pFVar5 != (FTexture *)0x0) && (((FNullStringData *)(local_40.Chars + -0xc))->Len != 0)) {
    if ((pFVar5->field_0x31 & 0xc0) == 0) {
      (pFVar5->gl_info).shaderspeed = local_34;
      pFVar1 = usershaders.Array;
      uVar7 = (ulong)usershaders.Count;
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          iVar4 = strcasecmp(pFVar1[uVar6].Chars,__s2.Chars);
          if (iVar4 == 0) goto LAB_0045814c;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      TArray<FString,_FString>::Grow(&usershaders,1);
      FString::AttachToOther(usershaders.Array + usershaders.Count,&local_40);
      uVar6 = (ulong)usershaders.Count;
      usershaders.Count = usershaders.Count + 1;
LAB_0045814c:
      (pFVar5->gl_info).shaderindex = (int)uVar6 + 0xc;
    }
    else {
      Printf("Cannot combine warping with hardware shader on texture \'%s\'\n",(pFVar5->Name).Chars)
      ;
    }
  }
  FString::~FString(&local_40);
  return;
}

Assistant:

void gl_ParseHardwareShader(FScanner &sc, int deflump)
{
	int type = FTexture::TEX_Any;
	bool disable_fullbright=false;
	bool thiswad = false;
	bool iwad = false;
	int maplump = -1;
	FString maplumpname;
	float speed = 1.f;

	sc.MustGetString();
	if (sc.Compare("texture")) type = FTexture::TEX_Wall;
	else if (sc.Compare("flat")) type = FTexture::TEX_Flat;
	else if (sc.Compare("sprite")) type = FTexture::TEX_Sprite;
	else sc.UnGet();

	sc.MustGetString();
	FTextureID no = TexMan.CheckForTexture(sc.String, type);
	FTexture *tex = TexMan[no];

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		sc.MustGetString();
		if (sc.Compare("shader"))
		{
			sc.MustGetString();
			maplumpname = sc.String;
		}
		else if (sc.Compare("speed"))
		{
			sc.MustGetFloat();
			speed = float(sc.Float);
		}
	}
	if (!tex)
	{
		return;
	}

	if (maplumpname.IsNotEmpty())
	{
		if (tex->bWarped != 0)
		{
			Printf("Cannot combine warping with hardware shader on texture '%s'\n", tex->Name.GetChars());
			return;
		}
		tex->gl_info.shaderspeed = speed; 
		for(unsigned i=0;i<usershaders.Size();i++)
		{
			if (!usershaders[i].CompareNoCase(maplumpname))
			{
				tex->gl_info.shaderindex = i + FIRST_USER_SHADER;
				return;
			}
		}
		tex->gl_info.shaderindex = usershaders.Push(maplumpname) + FIRST_USER_SHADER;
	}	
}